

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopl_file.c
# Opt level: O2

int WOPL_SaveBankToMem(WOPLFile *file,void *dest_mem,size_t length,uint16_t version,
                      uint16_t force_gm)

{
  WOPLBank *pWVar1;
  ushort version_00;
  uint uVar2;
  int iVar3;
  long lVar4;
  undefined6 in_register_00000082;
  ulong uVar5;
  long lVar6;
  uint8_t *cursor;
  bool bVar7;
  uint16_t bankslots_sizes [2];
  ulong local_88;
  WOPLBank *local_78 [3];
  ulong local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  bankslots_sizes[0] = 1;
  bankslots_sizes[1] = 1;
  if ((int)CONCAT62(in_register_00000082,force_gm) == 0) {
    bankslots_sizes[0] = file->banks_count_melodic;
    bankslots_sizes[1] = file->banks_count_percussion;
  }
  version_00 = 3;
  if (version != 0) {
    version_00 = version;
  }
  iVar3 = 2;
  if (10 < length) {
    *(undefined8 *)dest_mem = 0x41422d334c504f57;
    *(undefined4 *)((long)dest_mem + 7) = 0x4b4e41;
    if ((((1 < length - 0xb) && (*(ushort *)((long)dest_mem + 0xb) = version_00, 1 < length - 0xd))
        && (*(uint16_t *)((long)dest_mem + 0xd) = bankslots_sizes[0] << 8 | bankslots_sizes[0] >> 8,
           1 < length - 0xf)) &&
       (*(uint16_t *)((long)dest_mem + 0xf) = bankslots_sizes[1] << 8 | bankslots_sizes[1] >> 8,
       1 < length - 0x11)) {
      *(uint8_t *)((long)dest_mem + 0x11) = file->opl_flags;
      *(uint8_t *)((long)dest_mem + 0x12) = file->volume_model;
      cursor = (uint8_t *)((long)dest_mem + 0x13);
      local_88 = length - 0x13;
      local_78[0] = file->banks_melodic;
      local_78[1] = file->banks_percussive;
      if (1 < version_00) {
        for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
          lVar6 = 0;
          for (uVar5 = 0; uVar5 < bankslots_sizes[lVar4]; uVar5 = uVar5 + 1) {
            bVar7 = local_88 < 0x22;
            local_88 = local_88 - 0x22;
            if (bVar7) {
              return 2;
            }
            pWVar1 = local_78[lVar4];
            strncpy((char *)cursor,pWVar1->bank_name + lVar6,0x20);
            cursor[0x20] = pWVar1->ins[0].inst_name[lVar6 + -3];
            cursor[0x21] = local_78[lVar4]->ins[0].inst_name[lVar6 + -2];
            cursor = cursor + 0x22;
            lVar6 = lVar6 + 0x2224;
          }
        }
      }
      uVar2 = (uint)(2 < version_00) * 0x200 + 0x1f00;
      local_60 = (ulong)uVar2;
      local_58 = (ulong)(ushort)uVar2;
      for (local_40 = 0; local_40 != 2; local_40 = local_40 + 1) {
        local_48 = (ulong)bankslots_sizes[local_40];
        if (local_88 < local_48 * local_58) {
          return 2;
        }
        local_50 = local_60 * local_48;
        lVar4 = 0;
        for (local_38 = 0; local_38 != local_48; local_38 = local_38 + 1) {
          pWVar1 = local_78[local_40];
          for (lVar6 = 0x24; lVar6 != 0x2224; lVar6 = lVar6 + 0x44) {
            WOPL_writeInstrument
                      ((WOPLInstrument *)(pWVar1->bank_name + lVar6 + lVar4),cursor,version_00,
                       '\x01');
            cursor = cursor + (ulong)(2 < version_00) * 4 + 0x3e;
          }
          lVar4 = lVar4 + 0x2224;
        }
        local_88 = local_88 - local_50;
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int WOPL_SaveBankToMem(WOPLFile *file, void *dest_mem, size_t length, uint16_t version, uint16_t force_gm)
{
    uint8_t *cursor = (uint8_t *)dest_mem;
    uint16_t ins_size = 0;
    uint16_t i, j, k;
    uint16_t banks_melodic = force_gm ? 1 : file->banks_count_melodic;
    uint16_t banks_percusive = force_gm ? 1 : file->banks_count_percussion;

    WOPLBank *bankslots[2];
    uint16_t  bankslots_sizes[2];

    if(version == 0)
        version = wopl_latest_version;

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    if(length < 11)
        return WOPL_ERR_UNEXPECTED_ENDING;
    memcpy(cursor, wopl3_magic, 11);
    GO_FORWARD(11);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16LE(version, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16BE(banks_melodic, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16BE(banks_percusive, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    cursor[0] = file->opl_flags;
    cursor[1] = file->volume_model;
    GO_FORWARD(2);

    bankslots[0]        = file->banks_melodic;
    bankslots_sizes[0]  = banks_melodic;
    bankslots[1]        = file->banks_percussive;
    bankslots_sizes[1]  = banks_percusive;

    if(version >= 2)
    {
        for(i = 0; i < 2; i++)
        {
            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                if(length < 34)
                    return WOPL_ERR_UNEXPECTED_ENDING;
                strncpy((char*)cursor, bankslots[i][j].bank_name, 32);
                cursor[32] = bankslots[i][j].bank_midi_lsb;
                cursor[33] = bankslots[i][j].bank_midi_msb;
                GO_FORWARD(34);
            }
        }
    }

    {/* Write instruments data */
        if(version >= 3)
            ins_size = WOPL_INST_SIZE_V3;
        else
            ins_size = WOPL_INST_SIZE_V2;
        for(i = 0; i < 2; i++)
        {
            if(length < (ins_size * 128) * (size_t)bankslots_sizes[i])
                return WOPL_ERR_UNEXPECTED_ENDING;

            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                for(k = 0; k < 128; k++)
                {
                    WOPLInstrument *ins = &bankslots[i][j].ins[k];
                    WOPL_writeInstrument(ins, cursor, version, 1);
                    GO_FORWARD(ins_size);
                }
            }
        }
    }

    return WOPL_ERR_OK;
#undef GO_FORWARD
}